

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprIfFalse(Parse *pParse,Expr *pExpr,int dest,int jumpIfNull)

{
  byte bVar1;
  Vdbe *p;
  int iVar2;
  int in2;
  uint uVar3;
  Expr *pRight;
  long lVar4;
  int op;
  Expr *pEVar5;
  int regFree1;
  int regFree2;
  
  p = pParse->pVdbe;
  _regFree1 = 0;
  if (pExpr == (Expr *)0x0 || p == (Vdbe *)0x0) {
    return;
  }
  bVar1 = pExpr->op;
  if (bVar1 - 0x44 < 0xd) {
    op = (bVar1 + 1 ^ 1) - 1;
    switch((uint)bVar1) {
    case 0x44:
      uVar3 = sqlite3VdbeMakeLabel(p);
      pParse->iCacheLevel = pParse->iCacheLevel + 1;
      sqlite3ExprIfTrue(pParse,pExpr->pLeft,uVar3,jumpIfNull ^ 8);
      pEVar5 = pExpr->pRight;
      sqlite3ExprIfFalse(pParse,pEVar5,dest,jumpIfNull);
      if (p->aLabel != (int *)0x0) {
        p->aLabel[(int)~uVar3] = p->nOp;
      }
      sqlite3ExprCachePop(pParse,(int)pEVar5);
      break;
    case 0x45:
      sqlite3ExprIfFalse(pParse,pExpr->pLeft,dest,jumpIfNull);
      sqlite3ExprIfFalse(pParse,pExpr->pRight,dest,jumpIfNull);
      break;
    case 0x46:
      goto switchD_00164a2c_caseD_46;
    case 0x47:
      exprCodeBetween(pParse,pExpr,dest,0,jumpIfNull);
      break;
    case 0x48:
      if (jumpIfNull == 0) {
        uVar3 = sqlite3VdbeMakeLabel(p);
        sqlite3ExprCodeIN(pParse,pExpr,dest,uVar3);
        if (p->aLabel != (int *)0x0) {
          p->aLabel[(int)~uVar3] = p->nOp;
        }
      }
      else {
        sqlite3ExprCodeIN(pParse,pExpr,dest,dest);
      }
      break;
    case 0x49:
    case 0x4a:
      iVar2 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
      uVar3 = 0;
LAB_00164b76:
      sqlite3VdbeAddOp3(p,op,iVar2,dest,uVar3);
      break;
    default:
      iVar2 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
      in2 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
      pEVar5 = pExpr->pLeft;
      pRight = pExpr->pRight;
      goto LAB_00164ac1;
    }
  }
  else {
    if (bVar1 == 0x13) {
      sqlite3ExprIfTrue(pParse,pExpr->pLeft,dest,jumpIfNull);
      goto LAB_00164be2;
    }
    if (bVar1 != 0x92) {
      iVar2 = sqlite3ExprCodeTemp(pParse,pExpr,&regFree1);
      uVar3 = (uint)(jumpIfNull != 0);
      op = 0x1c;
      goto LAB_00164b76;
    }
switchD_00164a2c_caseD_46:
    iVar2 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    in2 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    op = (pExpr->op != 'F') + 0x4b;
    pEVar5 = pExpr->pLeft;
    pRight = pExpr->pRight;
    jumpIfNull = 0x80;
LAB_00164ac1:
    codeCompare(pParse,pEVar5,pRight,op,iVar2,in2,dest,jumpIfNull);
  }
LAB_00164be2:
  if (regFree1 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      lVar4 = 0;
      do {
        if (*(int *)((long)&pParse->aColCache[0].iReg + lVar4) == regFree1) {
          (&pParse->aColCache[0].tempReg)[lVar4] = '\x01';
          goto LAB_00164c1b;
        }
        lVar4 = lVar4 + 0x18;
      } while ((int)lVar4 != 0xf0);
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = regFree1;
    }
  }
LAB_00164c1b:
  if (regFree2 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      lVar4 = 0;
      do {
        if (*(int *)((long)&pParse->aColCache[0].iReg + lVar4) == regFree2) {
          (&pParse->aColCache[0].tempReg)[lVar4] = '\x01';
          return;
        }
        lVar4 = lVar4 + 0x18;
      } while ((int)lVar4 != 0xf0);
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = regFree2;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprIfFalse(Parse *pParse, Expr *pExpr, int dest, int jumpIfNull){
  Vdbe *v = pParse->pVdbe;
  int op = 0;
  int regFree1 = 0;
  int regFree2 = 0;
  int r1, r2;

  assert( jumpIfNull==SQLITE_JUMPIFNULL || jumpIfNull==0 );
  if( NEVER(v==0) ) return; /* Existence of VDBE checked by caller */
  if( pExpr==0 )    return;

  /* The value of pExpr->op and op are related as follows:
  **
  **       pExpr->op            op
  **       ---------          ----------
  **       TK_ISNULL          OP_NotNull
  **       TK_NOTNULL         OP_IsNull
  **       TK_NE              OP_Eq
  **       TK_EQ              OP_Ne
  **       TK_GT              OP_Le
  **       TK_LE              OP_Gt
  **       TK_GE              OP_Lt
  **       TK_LT              OP_Ge
  **
  ** For other values of pExpr->op, op is undefined and unused.
  ** The value of TK_ and OP_ constants are arranged such that we
  ** can compute the mapping above using the following expression.
  ** Assert()s verify that the computation is correct.
  */
  op = ((pExpr->op+(TK_ISNULL&1))^1)-(TK_ISNULL&1);

  /* Verify correct alignment of TK_ and OP_ constants
  */
  assert( pExpr->op!=TK_ISNULL || op==OP_NotNull );
  assert( pExpr->op!=TK_NOTNULL || op==OP_IsNull );
  assert( pExpr->op!=TK_NE || op==OP_Eq );
  assert( pExpr->op!=TK_EQ || op==OP_Ne );
  assert( pExpr->op!=TK_LT || op==OP_Ge );
  assert( pExpr->op!=TK_LE || op==OP_Gt );
  assert( pExpr->op!=TK_GT || op==OP_Le );
  assert( pExpr->op!=TK_GE || op==OP_Lt );

  switch( pExpr->op ){
    case TK_AND: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest, jumpIfNull);
      sqlite3ExprIfFalse(pParse, pExpr->pRight, dest, jumpIfNull);
      break;
    }
    case TK_OR: {
      int d2 = sqlite3VdbeMakeLabel(v);
      testcase( jumpIfNull==0 );
      sqlite3ExprCachePush(pParse);
      sqlite3ExprIfTrue(pParse, pExpr->pLeft, d2, jumpIfNull^SQLITE_JUMPIFNULL);
      sqlite3ExprIfFalse(pParse, pExpr->pRight, dest, jumpIfNull);
      sqlite3VdbeResolveLabel(v, d2);
      sqlite3ExprCachePop(pParse, 1);
      break;
    }
    case TK_NOT: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest, jumpIfNull);
      break;
    }
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      testcase( op==TK_LT );
      testcase( op==TK_LE );
      testcase( op==TK_GT );
      testcase( op==TK_GE );
      testcase( op==TK_EQ );
      testcase( op==TK_NE );
      testcase( jumpIfNull==0 );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, jumpIfNull);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_IS:
    case TK_ISNOT: {
      testcase( pExpr->op==TK_IS );
      testcase( pExpr->op==TK_ISNOT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      op = (pExpr->op==TK_IS) ? TK_NE : TK_EQ;
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      testcase( op==TK_ISNULL );
      testcase( op==TK_NOTNULL );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      sqlite3VdbeAddOp2(v, op, r1, dest);
      testcase( regFree1==0 );
      break;
    }
    case TK_BETWEEN: {
      testcase( jumpIfNull==0 );
      exprCodeBetween(pParse, pExpr, dest, 0, jumpIfNull);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_IN: {
      if( jumpIfNull ){
        sqlite3ExprCodeIN(pParse, pExpr, dest, dest);
      }else{
        int destIfNull = sqlite3VdbeMakeLabel(v);
        sqlite3ExprCodeIN(pParse, pExpr, dest, destIfNull);
        sqlite3VdbeResolveLabel(v, destIfNull);
      }
      break;
    }
#endif
    default: {
      r1 = sqlite3ExprCodeTemp(pParse, pExpr, &regFree1);
      sqlite3VdbeAddOp3(v, OP_IfNot, r1, dest, jumpIfNull!=0);
      testcase( regFree1==0 );
      testcase( jumpIfNull==0 );
      break;
    }
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);
}